

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O2

void __thiscall
agge::tests::mocks::font_accessor::font_accessor<1ul,2ul>
          (font_accessor *this,font_metrics *metrics_,char_to_index (*indices) [1],
          glyph (*glyphs) [2])

{
  real_t rVar1;
  unsigned_long *__p;
  allocator_type local_29;
  
  (this->super_accessor)._vptr_accessor = (_func_int **)&PTR_get_descriptor_001c65d0;
  this->glyph_mapping_calls = 0;
  __p = (unsigned_long *)operator_new(8);
  *__p = 0;
  std::__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<unsigned_long,void>
            ((__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2> *)&this->glyphs_loaded,__p);
  (this->descriptor).family._M_dataplus._M_p = (pointer)&(this->descriptor).family.field_2;
  (this->descriptor).family._M_string_length = 0;
  (this->descriptor).family.field_2._M_local_buf[0] = '\0';
  rVar1 = metrics_->descent;
  (this->_metrics).ascent = metrics_->ascent;
  (this->_metrics).descent = rVar1;
  (this->_metrics).leading = metrics_->leading;
  std::
  map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  ::map<agge::tests::mocks::font_accessor::char_to_index_const*>
            ((map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              *)&this->_indices,*indices,indices[1]);
  std::
  vector<agge::tests::mocks::font_accessor::glyph,std::allocator<agge::tests::mocks::font_accessor::glyph>>
  ::vector<agge::tests::mocks::font_accessor::glyph*,void>
            ((vector<agge::tests::mocks::font_accessor::glyph,std::allocator<agge::tests::mocks::font_accessor::glyph>>
              *)&this->_glyphs,*glyphs,glyphs[1],&local_29);
  (this->_allocated).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_allocated).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

inline font_accessor::font_accessor(const font_metrics &metrics_, const char_to_index (&indices)[indices_n],
					glyph (&glyphs)[glyphs_n])
				: glyph_mapping_calls(0), glyphs_loaded(new size_t(0)), _metrics(metrics_),
					_indices(indices, indices + indices_n), _glyphs(glyphs, glyphs + glyphs_n)/*,
					_allocated(allocated)*/
			{
				if (_allocated)
					++*_allocated;
			}